

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
          (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *this,
          dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *other)

{
  uint uVar1;
  pointer pvVar2;
  pointer puVar3;
  ulong uVar4;
  long lVar5;
  allocator_type my_alloc;
  allocator_type local_11;
  
  this->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00216098;
  uVar1 = other->elem_count;
  this->elems = (pointer)0x0;
  this->elem_count = uVar1;
  if ((ulong)uVar1 == 0) {
    puVar3 = (pointer)0x0;
    uVar4 = 0;
  }
  else {
    puVar3 = std::allocator_traits<std::allocator<unsigned_int>_>::allocate(&local_11,(ulong)uVar1);
    this->elems = puVar3;
    uVar4 = (ulong)this->elem_count;
  }
  pvVar2 = other->elems;
  for (lVar5 = 0; uVar4 * 4 != lVar5; lVar5 = lVar5 + 4) {
    *(undefined4 *)((long)puVar3 + lVar5) = *(undefined4 *)((long)pvVar2 + lVar5);
  }
  return;
}

Assistant:

constexpr dynamic_array(const dynamic_array& other)
      : elem_count(other.size())
    {
      allocator_type my_alloc;

      if(elem_count > static_cast<size_type>(UINT8_C(0)))
      {
        elems = std::allocator_traits<allocator_type>::allocate(my_alloc, elem_count);
      }

      #if defined(WIDE_INTEGER_NAMESPACE)
      WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::copy_unsafe(other.elems, other.elems + elem_count, elems);
      #else
      ::math::wide_integer::detail::copy_unsafe(other.elems, other.elems + elem_count, elems);
      #endif
    }